

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_fromCharCode(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  int in_ECX;
  JSValue JVar2;
  int32_t c;
  StringBuffer *b;
  StringBuffer b_s;
  int i;
  StringBuffer *in_stack_ffffffffffffff88;
  JSContext *in_stack_ffffffffffffff90;
  int32_t *in_stack_ffffffffffffffa8;
  JSContext *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8 [12];
  int iVar3;
  JSValueUnion local_10;
  int64_t local_8;
  
  string_buffer_init(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
  iVar3 = 0;
  while( true ) {
    if (in_ECX <= iVar3) {
      JVar2 = string_buffer_end((StringBuffer *)in_stack_ffffffffffffff90);
      return JVar2;
    }
    JVar2.tag._4_4_ = iVar3;
    JVar2._0_12_ = in_stack_ffffffffffffffb8;
    iVar1 = JS_ToInt32(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,JVar2);
    if ((iVar1 != 0) || (iVar1 = string_buffer_putc16(in_stack_ffffffffffffff88,0), iVar1 != 0))
    break;
    iVar3 = iVar3 + 1;
  }
  string_buffer_free((StringBuffer *)0x1b7c4a);
  local_10.ptr = (void *)(local_10 << 0x20);
  local_8 = 6;
  return _local_10;
}

Assistant:

static JSValue js_string_fromCharCode(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    int i;
    StringBuffer b_s, *b = &b_s;

    string_buffer_init(ctx, b, argc);

    for(i = 0; i < argc; i++) {
        int32_t c;
        if (JS_ToInt32(ctx, &c, argv[i]) || string_buffer_putc16(b, c & 0xffff)) {
            string_buffer_free(b);
            return JS_EXCEPTION;
        }
    }
    return string_buffer_end(b);
}